

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

bool __thiscall ArgsManager::GetSettingsPath(ArgsManager *this,path *filepath,bool temp,bool backup)

{
  long in_FS_OFFSET;
  path settings;
  string in_stack_fffffffffffffee8;
  path local_f0;
  path local_c8;
  path local_a0;
  undefined1 local_78 [40];
  long local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"-settings",(allocator<char> *)&local_c8);
  fs::path::path((path *)&local_a0,"settings.json");
  GetPathArg((path *)(local_78 + 0x20),this,in_stack_fffffffffffffee8,(path *)local_78);
  std::filesystem::__cxx11::path::~path(&local_a0);
  std::__cxx11::string::~string((string *)local_78);
  if (local_50 != 0) {
    if (backup) {
      std::filesystem::__cxx11::path::operator+=((path *)(local_78 + 0x20),".bak");
    }
    if (filepath != (path *)0x0) {
      GetDataDirNet((path *)&local_c8,this);
      if (temp) {
        std::filesystem::__cxx11::path::path
                  ((path *)&stack0xfffffffffffffee8,(path *)(local_78 + 0x20));
        std::filesystem::__cxx11::path::operator+=((path *)&stack0xfffffffffffffee8,".tmp");
        std::filesystem::__cxx11::path::path(&local_f0,(path *)&stack0xfffffffffffffee8);
      }
      else {
        std::filesystem::__cxx11::path::path(&local_f0,(path *)(local_78 + 0x20));
      }
      fsbridge::AbsPathJoin((path *)&local_a0,(path *)&local_c8,(path *)&local_f0);
      std::filesystem::__cxx11::path::operator=(&filepath->super_path,&local_a0);
      std::filesystem::__cxx11::path::~path(&local_a0);
      std::filesystem::__cxx11::path::~path(&local_f0);
      if (temp) {
        std::filesystem::__cxx11::path::~path((path *)&stack0xfffffffffffffee8);
      }
      std::filesystem::__cxx11::path::~path(&local_c8);
    }
  }
  std::filesystem::__cxx11::path::~path((path *)(local_78 + 0x20));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return local_50 != 0;
  }
  __stack_chk_fail();
}

Assistant:

bool ArgsManager::GetSettingsPath(fs::path* filepath, bool temp, bool backup) const
{
    fs::path settings = GetPathArg("-settings", BITCOIN_SETTINGS_FILENAME);
    if (settings.empty()) {
        return false;
    }
    if (backup) {
        settings += ".bak";
    }
    if (filepath) {
        *filepath = fsbridge::AbsPathJoin(GetDataDirNet(), temp ? settings + ".tmp" : settings);
    }
    return true;
}